

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target)

{
  int32 iVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  char cVar4;
  uint uVar5;
  uint8 *puVar6;
  FieldOptions *this_00;
  
  uVar5 = this->_has_bits_[0];
  if ((uVar5 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar6);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,SERIALIZE)
    ;
    psVar2 = this->extendee_;
    *target = '\x12';
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar6);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 2) != 0) {
    iVar1 = this->number_;
    *target = '\x18';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar1,target + 1);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 4) != 0) {
    iVar1 = this->label_;
    *target = ' ';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar1,target + 1);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 8) != 0) {
    iVar1 = this->type_;
    *target = '(';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar1,target + 1);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->type_name_->_M_dataplus)._M_p,(int)this->type_name_->_M_string_length,
               SERIALIZE);
    psVar2 = this->type_name_;
    *target = '2';
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar6);
    uVar5 = this->_has_bits_[0];
  }
  cVar4 = (char)uVar5;
  if ((uVar5 & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->default_value_->_M_dataplus)._M_p,(int)this->default_value_->_M_string_length,
               SERIALIZE);
    psVar2 = this->default_value_;
    *target = ':';
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar2->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar2,puVar6);
    cVar4 = (char)this->_has_bits_[0];
  }
  if (cVar4 < '\0') {
    this_00 = this->options_;
    if (this_00 == (FieldOptions *)0x0) {
      this_00 = *(FieldOptions **)(default_instance_ + 0x38);
    }
    *target = 'B';
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 1);
    target = FieldOptions::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}